

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O0

void Llb_ManTestCuts(Aig_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Aig_Obj_t *pObj_00;
  uint local_1c;
  int Count;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  Aig_ManFanoutStart(p);
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), (int)local_1c < iVar1; local_1c = local_1c + 1)
  {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_1c);
    if (((pObj_00 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0)) &&
       (iVar1 = Aig_ObjRefs(pObj_00), 1 < iVar1)) {
      uVar2 = Llb_ManTracePaths(p,pObj_00);
      uVar3 = Aig_ObjLevel(pObj_00);
      uVar4 = Aig_ObjRefs(pObj_00);
      printf("Obj =%5d.  Lev =%3d.  Fanout =%5d.  Count = %3d.\n",(ulong)local_1c,(ulong)uVar3,
             (ulong)uVar4,(ulong)uVar2);
    }
  }
  Aig_ManFanoutStop(p);
  return;
}

Assistant:

void Llb_ManTestCuts( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Count;
    Aig_ManFanoutStart( p );
    Aig_ManForEachNode( p, pObj, i )
    {
        if ( Aig_ObjRefs(pObj) <= 1 )
            continue;
        Count = Llb_ManTracePaths( p, pObj );
        printf( "Obj =%5d.  Lev =%3d.  Fanout =%5d.  Count = %3d.\n", 
            i, Aig_ObjLevel(pObj), Aig_ObjRefs(pObj), Count );
    }
    Aig_ManFanoutStop( p );
}